

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O3

bool __thiscall
cmConditionEvaluator::GetBooleanValueWithAutoDereference
          (cmConditionEvaluator *this,cmExpandedCommandArgument *newArg,string *errorString,
          MessageType *status,bool oneArg)

{
  PolicyStatus PVar1;
  bool bVar2;
  bool bVar3;
  string *psVar4;
  long *plVar5;
  undefined8 *puVar6;
  ulong *puVar7;
  ulong uVar8;
  undefined8 uVar9;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  long *local_90;
  undefined8 local_88;
  long local_80;
  undefined8 uStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->Policy12Status == OLD) {
    bVar2 = GetBooleanValueOld(this,newArg,oneArg);
    return bVar2;
  }
  if (this->Policy12Status == NEW) {
    bVar2 = GetBooleanValue(this,newArg);
    return bVar2;
  }
  bVar2 = GetBooleanValue(this,newArg);
  bVar3 = GetBooleanValueOld(this,newArg,oneArg);
  if (bVar2 == bVar3) {
    return bVar2;
  }
  PVar1 = this->Policy12Status;
  if (1 < PVar1 - REQUIRED_IF_USED) {
    if (PVar1 == OLD) {
      return bVar3;
    }
    if (PVar1 != WARN) {
      return bVar2;
    }
    psVar4 = cmExpandedCommandArgument::GetValue_abi_cxx11_(newArg);
    std::operator+(&local_50,"An argument named \"",psVar4);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
    puVar7 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar7) {
      local_a0 = *puVar7;
      lStack_98 = plVar5[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *puVar7;
      local_b0 = (ulong *)*plVar5;
    }
    local_a8 = plVar5[1];
    *plVar5 = (long)puVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_70,(cmPolicies *)0xc,(PolicyID)local_a8);
    uVar8 = 0xf;
    if (local_b0 != &local_a0) {
      uVar8 = local_a0;
    }
    if (uVar8 < local_70._M_string_length + local_a8) {
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        uVar9 = local_70.field_2._M_allocated_capacity;
      }
      if (local_70._M_string_length + local_a8 <= (ulong)uVar9) {
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_b0);
        goto LAB_0059facc;
      }
    }
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_70._M_dataplus._M_p);
LAB_0059facc:
    local_90 = &local_80;
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_80 = *plVar5;
      uStack_78 = puVar6[3];
    }
    else {
      local_80 = *plVar5;
      local_90 = (long *)*puVar6;
    }
    local_88 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)plVar5 = 0;
    std::__cxx11::string::operator=((string *)errorString,(string *)&local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    *status = AUTHOR_WARNING;
    return bVar3;
  }
  psVar4 = cmExpandedCommandArgument::GetValue_abi_cxx11_(newArg);
  std::operator+(&local_50,"An argument named \"",psVar4);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar7 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar7) {
    local_a0 = *puVar7;
    lStack_98 = plVar5[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *puVar7;
    local_b0 = (ulong *)*plVar5;
  }
  local_a8 = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_70,(cmPolicies *)0xc,(PolicyID)local_a8);
  uVar8 = 0xf;
  if (local_b0 != &local_a0) {
    uVar8 = local_a0;
  }
  if (uVar8 < local_70._M_string_length + local_a8) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      uVar9 = local_70.field_2._M_allocated_capacity;
    }
    if (local_70._M_string_length + local_a8 <= (ulong)uVar9) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_b0);
      goto LAB_0059f975;
    }
  }
  puVar6 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_70._M_dataplus._M_p);
LAB_0059f975:
  local_90 = &local_80;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_80 = *plVar5;
    uStack_78 = puVar6[3];
  }
  else {
    local_80 = *plVar5;
    local_90 = (long *)*puVar6;
  }
  local_88 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  std::__cxx11::string::operator=((string *)errorString,(string *)&local_90);
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  *status = FATAL_ERROR;
  return bVar2;
}

Assistant:

bool cmConditionEvaluator::GetBooleanValueWithAutoDereference(
  cmExpandedCommandArgument& newArg, std::string& errorString,
  MessageType& status, bool const oneArg) const
{
  // Use the policy if it is set.
  if (this->Policy12Status == cmPolicies::NEW) {
    return this->GetBooleanValue(newArg);
  }
  if (this->Policy12Status == cmPolicies::OLD) {
    return this->GetBooleanValueOld(newArg, oneArg);
  }

  // Check policy only if old and new results differ.
  const auto newResult = this->GetBooleanValue(newArg);
  const auto oldResult = this->GetBooleanValueOld(newArg, oneArg);
  if (newResult != oldResult) {
    switch (this->Policy12Status) {
      case cmPolicies::WARN:
        errorString = "An argument named \"" + newArg.GetValue() +
          "\" appears in a conditional statement.  " +
          cmPolicies::GetPolicyWarning(cmPolicies::CMP0012);
        status = MessageType::AUTHOR_WARNING;
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        return oldResult;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS: {
        errorString = "An argument named \"" + newArg.GetValue() +
          "\" appears in a conditional statement.  " +
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0012);
        status = MessageType::FATAL_ERROR;
        break;
      }
      case cmPolicies::NEW:
        break;
    }
  }
  return newResult;
}